

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NamedDescribedEntity.cpp
# Opt level: O1

string * __thiscall
NamedDescribedEntity::SoftPrint_abi_cxx11_
          (string *__return_storage_ptr__,NamedDescribedEntity *this)

{
  pointer pcVar1;
  ostream *poVar2;
  stringstream ss;
  long *local_1f0;
  long local_1e8;
  long local_1e0 [2];
  long *local_1d0;
  long local_1c8;
  long local_1c0 [2];
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"name:",5);
  pcVar1 = (this->_m_name)._M_dataplus._M_p;
  local_1d0 = local_1c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d0,pcVar1,pcVar1 + (this->_m_name)._M_string_length);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(local_1a0,(char *)local_1d0,local_1c8)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," - descr.",9);
  pcVar1 = (this->_m_description)._M_dataplus._M_p;
  local_1f0 = local_1e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f0,pcVar1,pcVar1 + (this->_m_description)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_1f0,local_1e8);
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0,local_1e0[0] + 1);
  }
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0,local_1c0[0] + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

string NamedDescribedEntity::SoftPrint() const 
{ 
    stringstream ss;
    ss << "name:" << this->GetName() 
       << " - descr." << this->GetDescription(); 
    return(ss.str());
}